

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_int16 *
drwav_open_and_read_s16
          (drwav_read_proc onRead,drwav_seek_proc onSeek,void *pUserData,uint *channels,
          uint *sampleRate,drwav_uint64 *totalSampleCount)

{
  drwav_bool32 dVar1;
  drwav_int16 *pdVar2;
  drwav wav;
  drwav local_1c0;
  
  if (channels != (uint *)0x0) {
    *channels = 0;
  }
  if (sampleRate != (uint *)0x0) {
    *sampleRate = 0;
  }
  if (totalSampleCount != (drwav_uint64 *)0x0) {
    *totalSampleCount = 0;
  }
  pdVar2 = (drwav_int16 *)0x0;
  dVar1 = drwav_init_ex(&local_1c0,onRead,onSeek,(drwav_chunk_proc)0x0,pUserData,(void *)0x0,0);
  if (dVar1 != 0) {
    pdVar2 = drwav__read_and_close_s16(&local_1c0,channels,sampleRate,totalSampleCount);
  }
  return pdVar2;
}

Assistant:

drwav_int16* drwav_open_and_read_s16(drwav_read_proc onRead, drwav_seek_proc onSeek, void* pUserData, unsigned int* channels, unsigned int* sampleRate, drwav_uint64* totalSampleCount)
{
    if (channels) *channels = 0;
    if (sampleRate) *sampleRate = 0;
    if (totalSampleCount) *totalSampleCount = 0;

    drwav wav;
    if (!drwav_init(&wav, onRead, onSeek, pUserData)) {
        return NULL;
    }

    return drwav__read_and_close_s16(&wav, channels, sampleRate, totalSampleCount);
}